

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_env_open(MDB_env *env,char *path,uint flags,mdb_mode_t mode)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  MDB_IDL pMVar8;
  MDB_ID2L pMVar9;
  MDB_dbx *pMVar10;
  uint16_t *puVar11;
  uint *puVar12;
  ssize_t sVar13;
  ulong uVar14;
  int *piVar15;
  void *pvVar16;
  MDB_txn *pMVar17;
  int iVar18;
  MDB_txn **ppMVar19;
  ulong uVar20;
  uint uVar21;
  char *pcVar22;
  int iVar23;
  int iVar24;
  char *pcVar25;
  bool bVar26;
  int local_2dc;
  char *local_2d8;
  char *local_2d0;
  uint local_2c4;
  MDB_meta local_2c0;
  utsname local_238;
  statfs st;
  
  local_2dc = -1;
  if ((flags & 0xfe00bffe) != 0) {
    return 0x16;
  }
  if (env->me_fd != -1) {
    return 0x16;
  }
  sVar7 = strlen(path);
  iVar3 = (int)sVar7;
  iVar18 = iVar3 * 2 + 7;
  if ((flags >> 0xe & 1) == 0) {
    iVar18 = iVar3 * 2 + 0x14;
  }
  local_2d0 = (char *)malloc((long)iVar18);
  if (local_2d0 == (char *)0x0) {
    return 0xc;
  }
  if ((flags >> 0xe & 1) == 0) {
    pcVar25 = local_2d0 + (long)iVar3 + 10;
    sprintf(local_2d0,"%s/lock.mdb",path);
    sprintf(pcVar25,"%s/data.mdb",path);
  }
  else {
    pcVar25 = local_2d0 + (long)iVar3 + 6;
    sprintf(local_2d0,"%s-lock",path);
    strcpy(pcVar25,path);
  }
  uVar21 = flags | env->me_flags;
  if ((uVar21 >> 0x11 & 1) == 0) {
    pMVar8 = mdb_midl_alloc(0x1ffff);
    env->me_free_pgs = pMVar8;
    if (pMVar8 != (MDB_IDL)0x0) {
      pMVar9 = (MDB_ID2L)calloc(0x20000,0x10);
      env->me_dirty_list = pMVar9;
      if (pMVar9 != (MDB_ID2L)0x0) goto LAB_0010db38;
    }
    env->me_flags = uVar21 | 0x20000000;
    iVar3 = 0xc;
  }
  else {
    uVar21 = uVar21 & 0xfff7ffff;
LAB_0010db38:
    env->me_flags = uVar21 | 0x20000000;
    local_2d8 = pcVar25;
    pcVar25 = strdup(path);
    env->me_path = pcVar25;
    uVar14 = (ulong)env->me_maxdbs;
    pMVar10 = (MDB_dbx *)calloc(uVar14,0x30);
    env->me_dbxs = pMVar10;
    puVar11 = (uint16_t *)calloc(uVar14,2);
    env->me_dbflags = puVar11;
    puVar12 = (uint *)calloc(uVar14,4);
    env->me_dbiseqs = puVar12;
    iVar18 = 0xc;
    iVar3 = iVar18;
    if ((pcVar25 != (char *)0x0 && pMVar10 != (MDB_dbx *)0x0) &&
       (puVar12 != (uint *)0x0 && puVar11 != (uint16_t *)0x0)) {
      pMVar10->md_cmp = mdb_cmp_long;
      if (((uVar21 & 0x420000) != 0) ||
         (iVar3 = mdb_env_setup_locks(env,local_2d0,mode,&local_2dc), iVar3 == 0)) {
        uVar6 = 0x42;
        if ((uVar21 >> 0x11 & 1) != 0) {
          uVar6 = 0;
        }
        iVar3 = open(local_2d8,uVar6,(ulong)mode);
        env->me_fd = iVar3;
        if (iVar3 == -1) {
LAB_0010e12a:
          piVar15 = __errno_location();
          iVar3 = *piVar15;
        }
        else {
          if ((uVar21 & 0x420000) == 0x20000) {
            iVar3 = mdb_env_setup_locks(env,local_2d0,mode,&local_2dc);
            if (iVar3 != 0) goto LAB_0010dcd6;
            iVar3 = env->me_fd;
          }
          uVar2 = env->me_flags;
          uVar4 = fstatfs(iVar3,(statfs *)&st);
          if (st.f_type == 0xef53) {
            iVar3 = uname(&local_238);
            uVar4 = CONCAT31((int3)((uint)iVar3 >> 8),local_238.release[0]);
            if (local_238.release[0] < '3') {
              iVar3 = bcmp(local_238.release,"2.6.32.",7);
              if (iVar3 == 0) {
                uVar4 = atoi(local_238.release + 7);
                if ((int)uVar4 < 0x3c) goto LAB_0010dd6d;
              }
              else {
                uVar4 = bcmp(local_238.release,"2.6.34.",7);
                if ((uVar4 != 0) || (uVar4 = atoi(local_238.release + 7), (int)uVar4 < 0xf)) {
LAB_0010dd6d:
                  pbVar1 = (byte *)((long)&env->me_flags + 3);
                  *pbVar1 = *pbVar1 | 8;
                }
              }
            }
            else if ((local_238.release[0] == '3') &&
                    (uVar4 = atoi(local_238.release + 2), (int)uVar4 < 6)) {
              if (uVar4 == 2) {
                uVar4 = atoi(local_238.release + 4);
                if ((int)uVar4 < 0x1e) goto LAB_0010dd6d;
              }
              else if ((uVar4 != 5) || (uVar4 = atoi(local_238.release + 4), (int)uVar4 < 4))
              goto LAB_0010dd6d;
            }
          }
          iVar24 = 0;
          iVar23 = 2;
          iVar3 = -0x7849;
          local_2c4 = uVar6;
          while (bVar26 = iVar23 != 0, iVar23 = iVar23 + -1, bVar26) {
            sVar13 = pread(env->me_fd,&local_238,0x98,(long)iVar24);
            iVar5 = (int)sVar13;
            if (iVar5 != 0x98) {
              if (iVar24 == 0 && iVar5 == 0) {
                iVar3 = 2;
              }
              else {
                iVar3 = -0x7849;
                if (iVar5 < 0) {
                  piVar15 = __errno_location();
                  iVar3 = *piVar15;
                  if (iVar3 == 0) {
                    uVar4 = local_2c0.mm_dbs[0].md_pad;
                    break;
                  }
                }
              }
LAB_0010de31:
              if (iVar3 != 2) goto LAB_0010e132;
              uVar6 = 0x8000;
              if (env->me_os_psize < 0x8000) {
                uVar6 = env->me_os_psize;
              }
              env->me_psize = uVar6;
              local_2c0.mm_txnid = 0;
              local_2c0.mm_dbs[1].md_entries = 0;
              local_2c0.mm_dbs[1].md_leaf_pages = 0;
              local_2c0.mm_dbs[1].md_overflow_pages = 0;
              local_2c0.mm_dbs[1].md_pad = 0;
              local_2c0.mm_dbs[1].md_flags = 0;
              local_2c0.mm_dbs[1].md_depth = 0;
              local_2c0.mm_dbs[1].md_branch_pages = 0;
              local_2c0.mm_dbs[0].md_entries = 0;
              local_2c0.mm_dbs[0].md_leaf_pages = 0;
              local_2c0.mm_dbs[0].md_overflow_pages = 0;
              local_2c0.mm_dbs[0].md_branch_pages = 0;
              local_2c0.mm_address = (char *)0x0;
              local_2c0.mm_magic = 0xbeefc0de;
              local_2c0.mm_version = 1;
              uVar14 = env->me_mapsize;
              local_2c0.mm_last_pg = 1;
              local_2c0.mm_dbs[0]._0_8_ = (ulong)CONCAT24((short)env->me_flags,uVar6) | 0x800000000;
              local_2c0.mm_dbs[0].md_root = 0xffffffffffffffff;
              local_2c0.mm_dbs[1].md_root = 0xffffffffffffffff;
              local_2c0.mm_mapsize = 0x100000;
              bVar26 = false;
              goto LAB_0010defb;
            }
            if (((local_238.sysname._8_8_ & 0x80000) == 0) ||
               (local_238.sysname._16_4_ != -0x41103f22)) goto LAB_0010de31;
            if (local_238.sysname._20_4_ != 1) {
              iVar3 = -0x784a;
              goto LAB_0010de31;
            }
            if ((iVar24 == 0) || (local_2c0.mm_txnid < (ulong)local_238.release._14_8_)) {
              memcpy(&local_2c0,local_238.sysname + 0x10,0x88);
            }
            iVar24 = iVar24 + local_2c0.mm_dbs[0].md_pad;
            uVar4 = local_2c0.mm_dbs[0].md_pad;
          }
          env->me_psize = uVar4;
          uVar14 = env->me_mapsize;
          bVar26 = true;
LAB_0010defb:
          pcVar25 = local_2d8;
          if (uVar14 == 0) {
            env->me_mapsize = local_2c0.mm_mapsize;
            uVar14 = local_2c0.mm_mapsize;
          }
          uVar20 = (local_2c0.mm_dbs[0]._0_8_ & 0xffffffff) * (local_2c0.mm_last_pg + 1);
          local_2c0.mm_mapsize = uVar14;
          if (uVar14 < uVar20) {
            env->me_mapsize = uVar20;
            local_2c0.mm_mapsize = uVar20;
          }
          pcVar22 = (char *)local_2c0.mm_address;
          if (bVar26) {
            if ((uVar2 & 1) == 0) {
              pcVar22 = (char *)0x0;
            }
            bVar26 = true;
LAB_0010df6d:
            iVar3 = mdb_env_map(env,pcVar22);
            if (iVar3 == 0) {
              if (!bVar26) {
                if ((uVar2 & 1) != 0) {
                  local_2c0.mm_address = env->me_map;
                }
                iVar3 = mdb_env_init_meta(env,&local_2c0);
                if (iVar3 != 0) goto LAB_0010e132;
              }
              uVar6 = env->me_psize - 0x10;
              env->me_maxfree_1pg = (uVar6 >> 3) - 1;
              env->me_nodemax = (uVar6 >> 2) * 2 - 2;
              env->me_maxpg = env->me_mapsize / (ulong)env->me_psize;
              if ((uVar21 & 0xa0000) == 0) {
                iVar3 = open(pcVar25,local_2c4 & 2 | 0x1000,(ulong)mode);
                env->me_mfd = iVar3;
                if (iVar3 == -1) goto LAB_0010e12a;
              }
              else {
                env->me_mfd = env->me_fd;
              }
              if (0 < local_2dc) {
                (env->me_txns->mt1).mtb.mtb_txnid =
                     env->me_metas[env->me_metas[0]->mm_txnid < env->me_metas[1]->mm_txnid]->
                     mm_txnid;
                local_238.sysname[0x18] = '\0';
                local_238.sysname[0x19] = '\0';
                local_238.sysname[0x1a] = '\0';
                local_238.sysname[0x1b] = '\0';
                local_238.sysname[0x1c] = '\0';
                local_238.sysname[0x1d] = '\0';
                local_238.sysname[0x1e] = '\0';
                local_238.sysname[0x1f] = '\0';
                local_238.sysname[0] = '\0';
                local_238.sysname[1] = '\0';
                local_238.sysname[2] = '\0';
                local_238.sysname[3] = '\0';
                local_238.sysname[4] = '\0';
                local_238.sysname[5] = '\0';
                local_238.sysname[6] = '\0';
                local_238.sysname[7] = '\0';
                local_238.sysname[8] = '\0';
                local_238.sysname[9] = '\0';
                local_238.sysname[10] = '\0';
                local_238.sysname[0xb] = '\0';
                local_238.sysname[0xc] = '\0';
                local_238.sysname[0xd] = '\0';
                local_238.sysname[0xe] = '\0';
                local_238.sysname[0xf] = '\0';
                local_238.sysname[0x10] = '\x01';
                local_238.sysname[0x11] = '\0';
                local_238.sysname[0x12] = '\0';
                local_238.sysname[0x13] = '\0';
                local_238.sysname[0x14] = '\0';
                local_238.sysname[0x15] = '\0';
                local_238.sysname[0x16] = '\0';
                local_238.sysname[0x17] = '\0';
                do {
                  iVar3 = 0;
                  iVar23 = fcntl(env->me_lfd,6,&local_238);
                  if (iVar23 == 0) break;
                  piVar15 = __errno_location();
                  iVar3 = *piVar15;
                } while (iVar3 == 4);
                if (iVar3 != 0) goto LAB_0010e132;
              }
              iVar23 = 0;
              if ((uVar21 >> 0x11 & 1) != 0) goto LAB_0010dce1;
              uVar21 = env->me_maxdbs;
              uVar14 = (ulong)uVar21;
              pvVar16 = calloc(1,(ulong)env->me_psize);
              env->me_pbuf = pvVar16;
              iVar3 = iVar18;
              if ((pvVar16 != (void *)0x0) &&
                 (pMVar17 = (MDB_txn *)calloc(1,(long)(int)(uVar21 * 0x3d + 0x88)),
                 pMVar17 != (MDB_txn *)0x0)) {
                pMVar17->mt_dbs = (MDB_db *)(pMVar17 + 1);
                ppMVar19 = &pMVar17[1].mt_parent + uVar14 * 6;
                pMVar17->mt_cursors = (MDB_cursor **)ppMVar19;
                pMVar17->mt_dbiseqs = (uint *)(ppMVar19 + uVar14);
                pMVar17->mt_dbflags = (uchar *)((long)(ppMVar19 + uVar14) + uVar14 * 4);
                pMVar17->mt_env = env;
                pMVar17->mt_dbxs = env->me_dbxs;
                pMVar17->mt_flags = 1;
                env->me_txn0 = pMVar17;
                goto LAB_0010dce1;
              }
              goto LAB_0010dcd6;
            }
          }
          else {
            if ((uVar2 & 1) != 0) {
              bVar26 = false;
              goto LAB_0010df6d;
            }
            iVar3 = mdb_env_init_meta(env,&local_2c0);
            if (iVar3 == 0) {
              bVar26 = true;
              pcVar22 = (char *)0x0;
              goto LAB_0010df6d;
            }
          }
        }
LAB_0010e132:
        if (iVar3 == 0) {
          iVar23 = 0;
          goto LAB_0010dce1;
        }
      }
    }
  }
LAB_0010dcd6:
  iVar23 = iVar3;
  mdb_env_close1(env);
LAB_0010dce1:
  free(local_2d0);
  return iVar23;
}

Assistant:

int ESECT
mdb_env_open(MDB_env *env, const char *path, unsigned int flags, mdb_mode_t mode)
{
	int		oflags, rc, len, excl = -1;
	char *lpath, *dpath;
#ifdef _WIN32
	wchar_t *wpath;
#endif

	if (env->me_fd!=INVALID_HANDLE_VALUE || (flags & ~(CHANGEABLE|CHANGELESS)))
		return EINVAL;

#ifdef MDB_VL32
	if (flags & MDB_WRITEMAP) {
		/* silently ignore WRITEMAP in 32 bit mode */
		flags ^= MDB_WRITEMAP;
	}
	if (flags & MDB_FIXEDMAP) {
		/* cannot support FIXEDMAP */
		return EINVAL;
	}
#endif

	len = strlen(path);
	if (flags & MDB_NOSUBDIR) {
		rc = len + sizeof(LOCKSUFF) + len + 1;
	} else {
		rc = len + sizeof(LOCKNAME) + len + sizeof(DATANAME);
	}
	lpath = malloc(rc);
	if (!lpath)
		return ENOMEM;
	if (flags & MDB_NOSUBDIR) {
		dpath = lpath + len + sizeof(LOCKSUFF);
		sprintf(lpath, "%s" LOCKSUFF, path);
		strcpy(dpath, path);
	} else {
		dpath = lpath + len + sizeof(LOCKNAME);
		sprintf(lpath, "%s" LOCKNAME, path);
		sprintf(dpath, "%s" DATANAME, path);
	}

	rc = MDB_SUCCESS;
	flags |= env->me_flags;
	if (flags & MDB_RDONLY) {
		/* silently ignore WRITEMAP when we're only getting read access */
		flags &= ~MDB_WRITEMAP;
	} else {
		if (!((env->me_free_pgs = mdb_midl_alloc(MDB_IDL_UM_MAX)) &&
			  (env->me_dirty_list = calloc(MDB_IDL_UM_SIZE, sizeof(MDB_ID2)))))
			rc = ENOMEM;
	}
#ifdef MDB_VL32
	if (!rc) {
		env->me_rpages = malloc(MDB_ERPAGE_SIZE * sizeof(MDB_ID3));
		if (!env->me_rpages) {
			rc = ENOMEM;
			goto leave;
		}
		env->me_rpages[0].mid = 0;
		env->me_rpcheck = MDB_ERPAGE_SIZE/2;
	}
#endif
	env->me_flags = flags |= MDB_ENV_ACTIVE;
	if (rc)
		goto leave;

	env->me_path = strdup(path);
	env->me_dbxs = calloc(env->me_maxdbs, sizeof(MDB_dbx));
	env->me_dbflags = calloc(env->me_maxdbs, sizeof(uint16_t));
	env->me_dbiseqs = calloc(env->me_maxdbs, sizeof(unsigned int));
	if (!(env->me_dbxs && env->me_path && env->me_dbflags && env->me_dbiseqs)) {
		rc = ENOMEM;
		goto leave;
	}
	env->me_dbxs[FREE_DBI].md_cmp = mdb_cmp_long; /* aligned MDB_INTEGERKEY */

	/* For RDONLY, get lockfile after we know datafile exists */
	if (!(flags & (MDB_RDONLY|MDB_NOLOCK))) {
		rc = mdb_env_setup_locks(env, lpath, mode, &excl);
		if (rc)
			goto leave;
	}

#ifdef _WIN32
	if (F_ISSET(flags, MDB_RDONLY)) {
		oflags = GENERIC_READ;
		len = OPEN_EXISTING;
	} else {
		oflags = GENERIC_READ|GENERIC_WRITE;
		len = OPEN_ALWAYS;
	}
	mode = FILE_ATTRIBUTE_NORMAL;
	rc = utf8_to_utf16(dpath, -1, &wpath, NULL);
	if (rc)
		goto leave;
	env->me_fd = CreateFileW(wpath, oflags, FILE_SHARE_READ|FILE_SHARE_WRITE,
		NULL, len, mode, NULL);
	free(wpath);
#else
	if (F_ISSET(flags, MDB_RDONLY))
		oflags = O_RDONLY;
	else
		oflags = O_RDWR | O_CREAT;

	env->me_fd = open(dpath, oflags, mode);
#endif
	if (env->me_fd == INVALID_HANDLE_VALUE) {
		rc = ErrCode();
		goto leave;
	}

	if ((flags & (MDB_RDONLY|MDB_NOLOCK)) == MDB_RDONLY) {
		rc = mdb_env_setup_locks(env, lpath, mode, &excl);
		if (rc)
			goto leave;
	}

	if ((rc = mdb_env_open2(env)) == MDB_SUCCESS) {
		if (flags & (MDB_RDONLY|MDB_WRITEMAP)) {
			env->me_mfd = env->me_fd;
		} else {
			/* Synchronous fd for meta writes. Needed even with
			 * MDB_NOSYNC/MDB_NOMETASYNC, in case these get reset.
			 */
#ifdef _WIN32
			len = OPEN_EXISTING;
			rc = utf8_to_utf16(dpath, -1, &wpath, NULL);
			if (rc)
				goto leave;
			env->me_mfd = CreateFileW(wpath, oflags,
				FILE_SHARE_READ|FILE_SHARE_WRITE, NULL, len,
				mode | FILE_FLAG_WRITE_THROUGH, NULL);
			free(wpath);
#else
			oflags &= ~O_CREAT;
			env->me_mfd = open(dpath, oflags | MDB_DSYNC, mode);
#endif
			if (env->me_mfd == INVALID_HANDLE_VALUE) {
				rc = ErrCode();
				goto leave;
			}
		}
		DPRINTF(("opened dbenv %p", (void *) env));
		if (excl > 0) {
			rc = mdb_env_share_locks(env, &excl);
			if (rc)
				goto leave;
		}
		if (!(flags & MDB_RDONLY)) {
			MDB_txn *txn;
			int tsize = sizeof(MDB_txn), size = tsize + env->me_maxdbs *
				(sizeof(MDB_db)+sizeof(MDB_cursor *)+sizeof(unsigned int)+1);
			if ((env->me_pbuf = calloc(1, env->me_psize)) &&
				(txn = calloc(1, size)))
			{
				txn->mt_dbs = (MDB_db *)((char *)txn + tsize);
				txn->mt_cursors = (MDB_cursor **)(txn->mt_dbs + env->me_maxdbs);
				txn->mt_dbiseqs = (unsigned int *)(txn->mt_cursors + env->me_maxdbs);
				txn->mt_dbflags = (unsigned char *)(txn->mt_dbiseqs + env->me_maxdbs);
				txn->mt_env = env;
#ifdef MDB_VL32
				txn->mt_rpages = malloc(MDB_TRPAGE_SIZE * sizeof(MDB_ID3));
				if (!txn->mt_rpages) {
					free(txn);
					rc = ENOMEM;
					goto leave;
				}
				txn->mt_rpages[0].mid = 0;
				txn->mt_rpcheck = MDB_TRPAGE_SIZE/2;
#endif
				txn->mt_dbxs = env->me_dbxs;
				txn->mt_flags = MDB_TXN_FINISHED;
				env->me_txn0 = txn;
			} else {
				rc = ENOMEM;
			}
		}
	}

leave:
	if (rc) {
		mdb_env_close0(env, excl);
	}
	free(lpath);
	return rc;
}